

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O2

void __thiscall QComboBoxListView::resizeEvent(QComboBoxListView *this,QResizeEvent *event)

{
  int iVar1;
  int iVar2;
  QWidget *pQVar3;
  QSize QVar4;
  
  pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar1 = (pQVar3->data->crect).x2.m_i;
  iVar2 = (pQVar3->data->crect).x1.m_i;
  QVar4 = QListView::contentsSize(&this->super_QListView);
  QListView::resizeContents(&this->super_QListView,(iVar1 - iVar2) + 1,QVar4.ht.m_i.m_i);
  QListView::resizeEvent(&this->super_QListView,event);
  return;
}

Assistant:

void resizeEvent(QResizeEvent *event) override
    {
        resizeContents(viewport()->width(), contentsSize().height());
        QListView::resizeEvent(event);
    }